

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_Inc.hpp
# Opt level: O2

void __thiscall
Diligent::SerializedPipelineStateImpl::
CreateDefaultResourceSignature<Diligent::PipelineStateVkImpl,Diligent::PipelineResourceSignatureVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
          (SerializedPipelineStateImpl *this,DeviceType Type,PipelineStateDesc *PSODesc,
          SHADER_TYPE ActiveShaderStageFlags,
          vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
          *ShaderStages)

{
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *pRVar1;
  SerializedResourceSignatureImpl *pSVar2;
  DoublePtrHelper<Diligent::SerializedResourceSignatureImpl> local_118;
  PipelineResourceSignatureDescWrapper SignDesc;
  
  PipelineStateVkImpl::GetDefaultResourceSignatureDesc
            (&SignDesc,ShaderStages,(PSODesc->super_DeviceObjectAttribs).Name,
             &PSODesc->ResourceLayout,PSODesc->SRBAllocationGranularity);
  pRVar1 = &this->m_pDefaultSignature;
  pSVar2 = (this->m_pDefaultSignature).m_pObject;
  if (pSVar2 == (SerializedResourceSignatureImpl *)0x0) {
    local_118.NewRawPtr = (SerializedResourceSignatureImpl *)0x0;
    local_118.m_pAutoPtr = pRVar1;
    SerializationDeviceImpl::CreateSerializedResourceSignature
              (this->m_pSerializationDevice,&local_118.NewRawPtr,
               SignDesc.m_Desc.super_DeviceObjectAttribs.Name);
    RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::
    DoublePtrHelper<Diligent::SerializedResourceSignatureImpl>::~DoublePtrHelper(&local_118);
    if (pRVar1->m_pObject == (SerializedResourceSignatureImpl *)0x0) {
      LogError<true,char[54],char_const*,char[3]>
                (false,"CreateDefaultResourceSignature",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
                 ,0x5e,(char (*) [54])"Failed to create default resource signature for PSO \'",
                 (char **)PSODesc,(char (*) [3])"\'.");
    }
  }
  else {
    PipelineResourceSignatureDescWrapper::SetName(&SignDesc,(pSVar2->m_Name)._M_dataplus._M_p);
  }
  SerializedResourceSignatureImpl::CreateDeviceSignature<Diligent::PipelineResourceSignatureVkImpl>
            (pRVar1->m_pObject,Type,&SignDesc.m_Desc,ActiveShaderStageFlags);
  PipelineResourceSignatureDescWrapper::~PipelineResourceSignatureDescWrapper(&SignDesc);
  return;
}

Assistant:

void SerializedPipelineStateImpl::CreateDefaultResourceSignature(DeviceType                   Type,
                                                                 const PipelineStateDesc&     PSODesc,
                                                                 SHADER_TYPE                  ActiveShaderStageFlags,
                                                                 const ShaderStagesArrayType& ShaderStages,
                                                                 const ExtraArgsType&... ExtraArgs)
{
    auto SignDesc = PipelineStateImplType::GetDefaultResourceSignatureDesc(ShaderStages, PSODesc.Name, PSODesc.ResourceLayout, PSODesc.SRBAllocationGranularity, ExtraArgs...);
    if (!m_pDefaultSignature)
    {
        // Create empty serialized signature
        m_pSerializationDevice->CreateSerializedResourceSignature(&m_pDefaultSignature, SignDesc.Get().Name);
        if (!m_pDefaultSignature)
            LOG_ERROR_AND_THROW("Failed to create default resource signature for PSO '", PSODesc.Name, "'.");
    }
    else
    {
        // Override the name to make sure it is consistent for all devices
        SignDesc.SetName(m_pDefaultSignature->GetName());
    }

    m_pDefaultSignature->CreateDeviceSignature<SignatureImplType>(Type, SignDesc, ActiveShaderStageFlags);
}